

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdge * __thiscall ON_SubD::EdgeFromId(ON_SubD *this,uint edge_id)

{
  ON_SubDimple *this_00;
  ON_SubDimple *subdimple;
  uint edge_id_local;
  ON_SubD *this_local;
  
  if (((edge_id == 0) || (edge_id == 0xffffffff)) ||
     (this_00 = SubDimple(this), this_00 == (ON_SubDimple *)0x0)) {
    this_local = (ON_SubD *)0x0;
  }
  else {
    this_local = (ON_SubD *)ON_SubDimple::EdgeFromId(this_00,edge_id);
  }
  return (ON_SubDEdge *)this_local;
}

Assistant:

const class ON_SubDEdge* ON_SubD::EdgeFromId(
  unsigned int edge_id
  ) const
{
  for (;;)
  {
    if (0 == edge_id || ON_UNSET_UINT_INDEX == edge_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->EdgeFromId(edge_id);
  }
  return nullptr;
}